

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O3

vector __thiscall sisl::utility::ppm_image::calc_minmax(ppm_image *this)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  DenseStorage<double,__1,__1,_1,_0> *other;
  int iVar4;
  Index extraout_RDX;
  uint d0;
  array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_RSI;
  uint uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  vector vVar13;
  double max;
  vector data;
  double *local_68;
  double *local_60;
  double *local_58;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  double *local_30;
  
  (this->m_aArray)._array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  (this->m_aArray)._dims[0] = 0;
  (this->m_aArray)._dims[1] = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,2,2,1);
  local_58 = (double *)0xfff0000000000000;
  iVar4 = *(int *)((long)&in_RSI[1]._array + 4);
  if (iVar4 < 1) {
    uVar7 = 0;
    uVar8 = 0x7ff00000;
  }
  else {
    iVar3 = *(int *)&in_RSI[1]._array;
    local_68 = (double *)0x7ff0000000000000;
    local_60 = (double *)0xfff0000000000000;
    d0 = 0;
    do {
      if (iVar3 < 1) {
        uVar7 = SUB84(local_68,0);
        uVar8 = (undefined4)((ulong)local_68 >> 0x20);
      }
      else {
        uVar6 = 0;
        do {
          other = (DenseStorage<double,__1,__1,_1,_0> *)
                  array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::operator()(in_RSI,d0,uVar6);
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_50,other);
          if (((local_50.m_row < 1) || (local_50.m_row == 1)) || ((ulong)local_50.m_row < 3)) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar1 = ((local_50.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_data;
          uVar7 = SUB84(pdVar1,0);
          uVar8 = (undefined4)((ulong)pdVar1 >> 0x20);
          bVar2 = (double)local_60 < (double)pdVar1;
          pdVar10 = pdVar1;
          if ((double)pdVar1 <= (double)local_60) {
            pdVar10 = local_60;
          }
          pdVar9 = (double *)
                   ((local_50.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   ).m_storage.m_rows;
          pdVar11 = pdVar1;
          if ((double)pdVar1 <= (double)local_60) {
            pdVar11 = local_60;
          }
          pdVar12 = pdVar9;
          if ((double)pdVar9 <= (double)pdVar11) {
            pdVar12 = pdVar10;
          }
          local_30 = local_50.m_xpr[1].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          local_60 = local_30;
          if ((double)local_30 <= (double)pdVar12) {
            local_60 = pdVar12;
          }
          if ((double)pdVar12 < (double)local_30 || (bVar2 || (double)pdVar11 < (double)pdVar9)) {
            local_58 = local_60;
          }
          if ((double)local_68 <= (double)pdVar1) {
            uVar7 = SUB84(local_68,0);
            uVar8 = (undefined4)((ulong)local_68 >> 0x20);
          }
          if ((double)CONCAT44(uVar8,uVar7) <= (double)pdVar9) {
            pdVar9 = (double *)CONCAT44(uVar8,uVar7);
          }
          if ((double)pdVar9 <= (double)local_30) {
            local_30 = pdVar9;
          }
          free(local_50.m_xpr);
          local_68 = local_30;
          uVar7 = SUB84(local_30,0);
          uVar8 = (undefined4)((ulong)local_30 >> 0x20);
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          iVar3 = *(int *)&in_RSI[1]._array;
        } while ((int)uVar5 < iVar3);
        iVar4 = *(int *)((long)&in_RSI[1]._array + 4);
      }
      d0 = d0 + 1;
    } while ((int)d0 < iVar4);
  }
  local_50.m_row = 0;
  local_50.m_col = 1;
  local_50.m_currentBlockRows = 1;
  local_50.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  if (*(long *)(this->m_aArray)._dims < 1) {
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  (((this->m_aArray)._array)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
  m_storage.m_data = (double *)CONCAT44(uVar8,uVar7);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (&local_50,(Scalar *)&local_58);
  if ((local_50.m_currentBlockRows + local_50.m_row ==
       *(long *)((array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&(local_50.m_xpr)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)->_dims) &&
     (local_50.m_col == 1)) {
    vVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    vVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (vector)vVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

vector calc_minmax(){
                using namespace std;
                vector ret(2);
                double min = std::numeric_limits<double>::infinity();
                double max = -std::numeric_limits<double>::infinity();

                for(int i = 0; i < m_iWidth; i++) {
                    for(int j = 0; j < m_iHeight; j++) {
                        vector data = m_aArray(i,j);
                        if(data[0] < min) min = data[0];
                        if(data[1] < min) min = data[1];
                        if(data[2] < min) min = data[2];
                        if(data[0] > max) max = data[0];
                        if(data[1] > max) max = data[1];
                        if(data[2] > max) max = data[2];
                    }
                }
                ret << min, max;
                return ret;
            }